

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeHMS(DateTime *p)

{
  int iVar1;
  long *in_RDI;
  DateTime *unaff_retaddr;
  int day_min;
  int day_ms;
  
  if (*(char *)((long)in_RDI + 0x2a) == '\0') {
    computeJD(unaff_retaddr);
    iVar1 = (int)((*in_RDI + 43200000) % 86400000);
    in_RDI[4] = (long)((double)(iVar1 % 60000) / 1000.0);
    iVar1 = iVar1 / 60000;
    *(int *)(in_RDI + 3) = iVar1 % 0x3c;
    *(int *)((long)in_RDI + 0x14) = iVar1 / 0x3c;
    *(byte *)((long)in_RDI + 0x2c) = *(byte *)((long)in_RDI + 0x2c) & 0xfe;
    *(undefined1 *)((long)in_RDI + 0x2a) = 1;
  }
  return;
}

Assistant:

static void computeHMS(DateTime *p){
  int day_ms, day_min; /* milliseconds, minutes into the day */
  if( p->validHMS ) return;
  computeJD(p);
  day_ms = (int)((p->iJD + 43200000) % 86400000);
  p->s = (day_ms % 60000)/1000.0;
  day_min = day_ms/60000;
  p->m = day_min % 60;
  p->h = day_min / 60;
  p->rawS = 0;
  p->validHMS = 1;
}